

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O1

void __thiscall
Equality_resetNotEqualByVariable_Test::~Equality_resetNotEqualByVariable_Test
          (Equality_resetNotEqualByVariable_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, resetNotEqualByVariable)
{
    libcellml::ResetPtr r1 = createInitialisedReset();
    libcellml::ResetPtr r2 = createInitialisedReset();

    libcellml::VariablePtr v2 = libcellml::Variable::create("vB");
    r2->setVariable(v2);

    EXPECT_FALSE(r1->equals(r2));
    EXPECT_FALSE(r2->equals(r1));
}